

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

string * __thiscall
iutest::detail::ElementsAreArrayMatcher<int>::WhichIs
          (string *__return_storage_ptr__,ElementsAreArrayMatcher<int> *this,string *msg)

{
  char *pcVar1;
  iu_global_format_stringstream strm;
  undefined1 local_1a0 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  pcVar1 = "ElementsAreArrayForward: ";
  if (this->m_expected_elem_count != false) {
    pcVar1 = "ElementsAreArray: ";
  }
  std::operator<<((ostream *)(local_1a0 + 0x10),pcVar1);
  std::operator<<((ostream *)(local_1a0 + 0x10),(string *)msg);
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

::std::string WhichIs(const ::std::string& msg) const
    {
        iu_global_format_stringstream strm;
        if( m_expected_elem_count )
        {
            strm << "ElementsAreArray: ";
        }
        else
        {
            strm << "ElementsAreArrayForward: ";
        }
        strm << msg;
        return strm.str();
    }